

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBToRGB565DitherRow_C(uint8_t *src_argb,uint8_t *dst_rgb,uint32_t dither4,int width)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 local_24;
  uint32_t dither4_local;
  
  local_24 = dither4;
  if (1 < width) {
    uVar6 = 0;
    do {
      bVar1 = *(byte *)((long)&local_24 + (ulong)(uVar6 & 2));
      uVar9 = (uint)*src_argb + (uint)bVar1;
      if (0xfe < uVar9) {
        uVar9 = 0xff;
      }
      uVar10 = (uint)src_argb[1] + (uint)bVar1;
      if (0xfe < uVar10) {
        uVar10 = 0xff;
      }
      uVar2 = (uint)src_argb[2] + (uint)bVar1;
      if (0xfe < (uint)src_argb[2] + (uint)bVar1) {
        uVar2 = 0xff;
      }
      bVar1 = *(byte *)((long)&local_24 + (ulong)(uVar6 & 2) + 1);
      uVar8 = (uint)src_argb[4] + (uint)bVar1;
      if (0xfe < uVar8) {
        uVar8 = 0xff;
      }
      uVar7 = (uint)src_argb[5] + (uint)bVar1;
      if (0xfe < uVar7) {
        uVar7 = 0xff;
      }
      uVar3 = (uint)src_argb[6] + (uint)bVar1;
      if (0xfe < (uint)src_argb[6] + (uint)bVar1) {
        uVar3 = 0xff;
      }
      *(uint *)dst_rgb =
           (uVar3 & 0xfffffff8) << 0x18 | (uVar7 & 0xfc) << 0x13 |
           (uVar8 & 0xf8) << 0xd | (uVar2 & 0xf8) << 8 | (uVar9 >> 3) + (uVar10 & 0xfc) * 8;
      dst_rgb = (uint8_t *)((long)dst_rgb + 4);
      src_argb = src_argb + 8;
      uVar6 = uVar6 + 2;
    } while ((int)uVar6 < (int)(width - 1U));
  }
  if ((width & 1U) != 0) {
    bVar1 = *(byte *)((long)&local_24 + (ulong)(width - 1U & 2));
    uVar6 = (uint)*src_argb + (uint)bVar1;
    if (0xfe < uVar6) {
      uVar6 = 0xff;
    }
    uVar9 = (uint)src_argb[1] + (uint)bVar1;
    uVar4 = (ushort)uVar9;
    if (0xfe < uVar9) {
      uVar4 = 0xff;
    }
    uVar5 = (ushort)src_argb[2] + (ushort)bVar1;
    if (0xfe < (ushort)((ushort)src_argb[2] + (ushort)bVar1)) {
      uVar5 = 0xff;
    }
    *(ushort *)dst_rgb = (uVar5 & 0xf8) << 8 | (short)(uVar6 >> 3) + (uVar4 & 0xfc) * 8;
  }
  return;
}

Assistant:

void ARGBToRGB565DitherRow_C(const uint8_t* src_argb,
                             uint8_t* dst_rgb,
                             const uint32_t dither4,
                             int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    int dither0 = ((const unsigned char*)(&dither4))[x & 3];
    int dither1 = ((const unsigned char*)(&dither4))[(x + 1) & 3];
    uint8_t b0 = clamp255(src_argb[0] + dither0) >> 3;
    uint8_t g0 = clamp255(src_argb[1] + dither0) >> 2;
    uint8_t r0 = clamp255(src_argb[2] + dither0) >> 3;
    uint8_t b1 = clamp255(src_argb[4] + dither1) >> 3;
    uint8_t g1 = clamp255(src_argb[5] + dither1) >> 2;
    uint8_t r1 = clamp255(src_argb[6] + dither1) >> 3;
    WRITEWORD(dst_rgb, b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) |
                           (r1 << 27));
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    int dither0 = ((const unsigned char*)(&dither4))[(width - 1) & 3];
    uint8_t b0 = clamp255(src_argb[0] + dither0) >> 3;
    uint8_t g0 = clamp255(src_argb[1] + dither0) >> 2;
    uint8_t r0 = clamp255(src_argb[2] + dither0) >> 3;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 11);
  }
}